

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O0

void __thiscall
World_3df::mutate(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  double dVar1;
  int iVar2;
  type pFVar3;
  type pPVar4;
  creat_t *pcVar5;
  double dVar6;
  const_reference pvVar7;
  type pCVar8;
  undefined4 extraout_var;
  Msg local_490;
  undefined1 local_460 [24];
  string local_448 [32];
  Msg local_428;
  Msg local_3f8;
  Msg local_3c8;
  undefined1 local_398 [24];
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [32];
  Msg local_2e8;
  Msg local_2b8;
  Msg local_288;
  Msg local_258;
  Msg local_228;
  Msg local_1f8;
  Msg local_1c8;
  Msg local_198;
  Msg local_168;
  undefined1 local_138 [24];
  double m2;
  size_t mc;
  double m1;
  size_t i;
  size_t mcc;
  string local_f8 [48];
  Msg local_c8;
  Msg local_98;
  Msg local_68;
  pointer local_28;
  double prob;
  shared_ptr<Population> *dst_local;
  shared_ptr<Population> *param_1_local;
  World_3df *this_local;
  
  local_28 = (pointer)0x3f747ae147ae147b;
  prob = (double)dst;
  dst_local = param_1;
  param_1_local = (shared_ptr<Population> *)this;
  World::get_log((World *)&stack0xffffffffffffffc8);
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)&stack0xffffffffffffffc8);
  util::logging::Msg::Msg(&local_c8,"Mutowanie z p_m = ",L_NORM);
  util::logging::Msg::operator+(&local_98,&local_c8,0.005);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"...",(allocator *)((long)&mcc + 7));
  util::logging::Msg::operator+(&local_68,&local_98,(string *)local_f8);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_68);
  util::logging::Msg::~Msg(&local_68);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mcc + 7));
  util::logging::Msg::~Msg(&local_98);
  util::logging::Msg::~Msg(&local_c8);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)&stack0xffffffffffffffc8);
  i = 0;
  pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
  m1 = (double)pPVar4->ELITE_SIZE;
  while( true ) {
    dVar1 = m1;
    pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
    pcVar5 = Population::get_creatures(pPVar4);
    dVar6 = (double)std::
                    vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                    ::size(pcVar5);
    if ((ulong)dVar6 <= (ulong)dVar1) break;
    pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
    pcVar5 = Population::get_creatures(pPVar4);
    pvVar7 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[](pcVar5,(size_type)m1);
    pCVar8 = boost::shared_ptr<Creature>::operator->(pvVar7);
    mc = (size_t)Creature::get_fitness(pCVar8);
    pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
    iVar2 = (*pPVar4->_vptr_Population[4])(0x3f747ae147ae147b,pPVar4,m1);
    m2 = (double)CONCAT44(extraout_var,iVar2);
    pPVar4 = boost::shared_ptr<Population>::operator->((shared_ptr<Population> *)prob);
    pcVar5 = Population::get_creatures(pPVar4);
    pvVar7 = std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
             ::operator[](pcVar5,(size_type)m1);
    pCVar8 = boost::shared_ptr<Creature>::operator->(pvVar7);
    local_138._16_8_ = Creature::get_fitness(pCVar8);
    World::get_log((World *)local_138);
    pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                       ((shared_ptr<util::logging::File_logger> *)local_138);
    util::logging::Msg::Msg(&local_2e8,anon_var_dwarf_2acd6,L_NORM);
    util::logging::Msg::operator+(&local_2b8,&local_2e8,(longlong)m1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,anon_var_dwarf_2acec,&local_309);
    util::logging::Msg::operator+(&local_288,&local_2b8,(string *)local_308);
    util::logging::Msg::operator+(&local_258,&local_288,(longlong)m2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330," mutacji {",&local_331);
    util::logging::Msg::operator+(&local_228,&local_258,(string *)local_330);
    util::logging::Msg::operator+(&local_1f8,&local_228,(double)mc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358," -> ",&local_359);
    util::logging::Msg::operator+(&local_1c8,&local_1f8,(string *)local_358);
    util::logging::Msg::operator+(&local_198,&local_1c8,(double)local_138._16_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_380,"}",(allocator *)(local_398 + 0x17));
    util::logging::Msg::operator+(&local_168,&local_198,(string *)local_380);
    (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_168);
    util::logging::Msg::~Msg(&local_168);
    std::__cxx11::string::~string(local_380);
    std::allocator<char>::~allocator((allocator<char> *)(local_398 + 0x17));
    util::logging::Msg::~Msg(&local_198);
    util::logging::Msg::~Msg(&local_1c8);
    std::__cxx11::string::~string(local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    util::logging::Msg::~Msg(&local_1f8);
    util::logging::Msg::~Msg(&local_228);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    util::logging::Msg::~Msg(&local_258);
    util::logging::Msg::~Msg(&local_288);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    util::logging::Msg::~Msg(&local_2b8);
    util::logging::Msg::~Msg(&local_2e8);
    boost::shared_ptr<util::logging::File_logger>::~shared_ptr
              ((shared_ptr<util::logging::File_logger> *)local_138);
    i = (long)m2 + i;
    m1 = (double)((long)m1 + 1);
  }
  World::get_log((World *)local_398);
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)local_398);
  util::logging::Msg::Msg(&local_428,"... W sumie ",L_NORM);
  util::logging::Msg::operator+(&local_3f8,&local_428,i);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448," mutacji",(allocator *)(local_460 + 0x17));
  util::logging::Msg::operator+(&local_3c8,&local_3f8,(string *)local_448);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_3c8);
  util::logging::Msg::~Msg(&local_3c8);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)(local_460 + 0x17));
  util::logging::Msg::~Msg(&local_3f8);
  util::logging::Msg::~Msg(&local_428);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)local_398);
  World::get_log((World *)local_460);
  pFVar3 = boost::shared_ptr<util::logging::File_logger>::operator*
                     ((shared_ptr<util::logging::File_logger> *)local_460);
  util::logging::Msg::Msg(&local_490,anon_var_dwarf_2ac38,L_NORM);
  (*(pFVar3->super_Ostream_logger).super_Logger._vptr_Logger[3])(pFVar3,&local_490);
  util::logging::Msg::~Msg(&local_490);
  boost::shared_ptr<util::logging::File_logger>::~shared_ptr
            ((shared_ptr<util::logging::File_logger> *)local_460);
  return;
}

Assistant:

void World_3df::mutate( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{
	const double prob = 0.005;

	(*get_log()) << util::logging::Msg("Mutowanie z p_m = ") + prob + "...";

	size_t mcc = 0;
	for(size_t i = dst->ELITE_SIZE; i < dst->get_creatures().size(); ++i)
	{
		double m1 = dst->get_creatures()[i]->get_fitness();
		size_t mc = dst->mutate(i, prob);
		double m2 = dst->get_creatures()[i]->get_fitness();

		(*get_log()) << util::logging::Msg("... Stwór @ [") + static_cast<long long> (i) + "] zaliczył "
				+ static_cast<long long> (mc) + " mutacji {" + m1 + " -> " + m2 + "}";
		mcc += mc;

	}
	(*get_log()) << util::logging::Msg("... W sumie ") + static_cast<long long> (mcc) + " mutacji";

	(*get_log()) << "Już";
}